

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O0

int WOPL_SaveBankToMem(WOPLFile *file,void *dest_mem,size_t length,uint16_t version,
                      uint16_t force_gm)

{
  uint16_t in;
  uint16_t in_00;
  char *pcVar1;
  WOPLInstrument *ins;
  WOPLBank *pWStack_58;
  uint16_t bankslots_sizes [2];
  WOPLBank *bankslots [2];
  ushort local_40;
  ushort local_3e;
  uint16_t banks_percusive;
  uint16_t banks_melodic;
  uint16_t k;
  uint16_t j;
  uint16_t i;
  uint16_t ins_size;
  uint8_t *cursor;
  uint16_t force_gm_local;
  ulong uStack_28;
  uint16_t version_local;
  size_t length_local;
  void *dest_mem_local;
  WOPLFile *file_local;
  
  pcVar1 = wopl3_magic;
  if (force_gm == 0) {
    in = file->banks_count_melodic;
    in_00 = file->banks_count_percussion;
  }
  else {
    in = 1;
    in_00 = 1;
  }
  cursor._6_2_ = version;
  if (version == 0) {
    cursor._6_2_ = 3;
  }
  if (length < 0xb) {
    file_local._4_4_ = 2;
  }
  else {
    *(undefined8 *)dest_mem = *(undefined8 *)wopl3_magic;
    *(undefined2 *)((long)dest_mem + 8) = *(undefined2 *)(pcVar1 + 8);
    *(char *)((long)dest_mem + 10) = pcVar1[10];
    if (length - 0xb < 2) {
      file_local._4_4_ = 2;
    }
    else {
      fromUint16LE(cursor._6_2_,(uint8_t *)((long)dest_mem + 0xb));
      if (length - 0xd < 2) {
        file_local._4_4_ = 2;
      }
      else {
        fromUint16BE(in,(uint8_t *)((long)dest_mem + 0xd));
        if (length - 0xf < 2) {
          file_local._4_4_ = 2;
        }
        else {
          fromUint16BE(in_00,(uint8_t *)((long)dest_mem + 0xf));
          if (length - 0x11 < 2) {
            file_local._4_4_ = 2;
          }
          else {
            *(uint8_t *)((long)dest_mem + 0x11) = file->opl_flags;
            *(uint8_t *)((long)dest_mem + 0x12) = file->volume_model;
            _k = (uint8_t *)((long)dest_mem + 0x13);
            uStack_28 = length - 0x13;
            pWStack_58 = file->banks_melodic;
            ins._4_2_ = in;
            ins._6_2_ = in_00;
            if (1 < cursor._6_2_) {
              for (banks_percusive = 0; banks_percusive < 2; banks_percusive = banks_percusive + 1)
              {
                for (local_3e = 0;
                    local_3e < *(ushort *)((long)&ins + (ulong)banks_percusive * 2 + 4);
                    local_3e = local_3e + 1) {
                  if (uStack_28 < 0x22) {
                    return 2;
                  }
                  strncpy((char *)_k,
                          (char *)(*(long *)((long)&stack0xffffffffffffffa8 +
                                            (ulong)banks_percusive * 8) + (ulong)local_3e * 0x2224),
                          0x20);
                  _k[0x20] = *(uint8_t *)
                              (*(long *)((long)&stack0xffffffffffffffa8 + (ulong)banks_percusive * 8
                                        ) + (ulong)local_3e * 0x2224 + 0x21);
                  _k[0x21] = *(uint8_t *)
                              (*(long *)((long)&stack0xffffffffffffffa8 + (ulong)banks_percusive * 8
                                        ) + (ulong)local_3e * 0x2224 + 0x22);
                  _k = _k + 0x22;
                  uStack_28 = uStack_28 - 0x22;
                }
              }
            }
            if (cursor._6_2_ < 3) {
              banks_melodic = 0x3e;
            }
            else {
              banks_melodic = 0x42;
            }
            for (banks_percusive = 0; banks_percusive < 2; banks_percusive = banks_percusive + 1) {
              if (uStack_28 <
                  (long)(int)((uint)banks_melodic << 7) *
                  (ulong)*(ushort *)((long)&ins + (ulong)banks_percusive * 2 + 4)) {
                return 2;
              }
              for (local_3e = 0; local_3e < *(ushort *)((long)&ins + (ulong)banks_percusive * 2 + 4)
                  ; local_3e = local_3e + 1) {
                for (local_40 = 0; local_40 < 0x80; local_40 = local_40 + 1) {
                  WOPL_writeInstrument
                            ((WOPLInstrument *)
                             (*(long *)((long)&stack0xffffffffffffffa8 + (ulong)banks_percusive * 8)
                              + (ulong)local_3e * 0x2224 + 0x24 + (ulong)local_40 * 0x44),_k,
                             cursor._6_2_,'\x01');
                  _k = _k + (int)(uint)banks_melodic;
                  uStack_28 = uStack_28 - banks_melodic;
                }
              }
            }
            file_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return file_local._4_4_;
}

Assistant:

int WOPL_SaveBankToMem(WOPLFile *file, void *dest_mem, size_t length, uint16_t version, uint16_t force_gm)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size = 0;
    uint16_t i, j, k;
    uint16_t banks_melodic = force_gm ? 1 : file->banks_count_melodic;
    uint16_t banks_percusive = force_gm ? 1 : file->banks_count_percussion;

    WOPLBank *bankslots[2];
    uint16_t  bankslots_sizes[2];

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    if(length < 11)
        return WOPL_ERR_UNEXPECTED_ENDING;
    memcpy(cursor, wopl3_magic, 11);
    GO_FORWARD(11);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16LE(version, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_melodic, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    fromUint16BE(banks_percusive, cursor);
    GO_FORWARD(2);

    if(length < 2)
        return WOPL_ERR_UNEXPECTED_ENDING;
    cursor[0] = file->opl_flags;
    cursor[1] = file->volume_model;
    GO_FORWARD(2);

    bankslots[0]        = file->banks_melodic;
    bankslots_sizes[0]  = banks_melodic;
    bankslots[1]        = file->banks_percussive;
    bankslots_sizes[1]  = banks_percusive;

    if(version >= 2)
    {
        for(i = 0; i < 2; i++)
        {
            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                if(length < 34)
                    return WOPL_ERR_UNEXPECTED_ENDING;
                strncpy((char*)cursor, bankslots[i][j].bank_name, 32);
                cursor[32] = bankslots[i][j].bank_midi_lsb;
                cursor[33] = bankslots[i][j].bank_midi_msb;
                GO_FORWARD(34);
            }
        }
    }

    {/* Write instruments data */
        if(version >= 3)
            ins_size = WOPL_INST_SIZE_V3;
        else
            ins_size = WOPL_INST_SIZE_V2;
        for(i = 0; i < 2; i++)
        {
            if(length < (ins_size * 128) * (size_t)bankslots_sizes[i])
                return WOPL_ERR_UNEXPECTED_ENDING;

            for(j = 0; j < bankslots_sizes[i]; j++)
            {
                for(k = 0; k < 128; k++)
                {
                    WOPLInstrument *ins = &bankslots[i][j].ins[k];
                    WOPL_writeInstrument(ins, cursor, version, 1);
                    GO_FORWARD(ins_size);
                }
            }
        }
    }

    return WOPL_ERR_OK;
#undef GO_FORWARD
}